

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  uint uVar1;
  ushort *puVar2;
  short *psVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  short sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  undefined1 auVar10 [16];
  uint uVar11;
  parasail_result_t *ppVar12;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar13;
  uint uVar14;
  long lVar15;
  __m128i *palVar16;
  int iVar17;
  undefined2 uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  int32_t segNum;
  long lVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  ushort uVar28;
  undefined4 uVar30;
  undefined4 uVar31;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ushort uVar43;
  short sVar45;
  __m128i alVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined4 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ushort uVar58;
  ushort uVar64;
  ushort uVar65;
  int iVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  undefined1 auVar59 [16];
  int iVar71;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  ushort uVar72;
  ushort uVar73;
  int iVar74;
  ushort uVar80;
  int iVar81;
  int iVar83;
  undefined1 auVar75 [16];
  int iVar84;
  undefined1 auVar76 [16];
  ushort uVar79;
  ushort uVar82;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  short sVar85;
  short sVar96;
  short sVar97;
  int iVar98;
  undefined1 in_XMM8 [16];
  undefined1 auVar86 [16];
  int iVar100;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  short sVar99;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  ushort local_c8;
  ushort uStack_c6;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar29;
  short sVar44;
  undefined1 auVar92 [16];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_scan_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_scan_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_scan_profile_sse2_128_16_cold_6();
      }
      else {
        uVar26 = profile->s1Len;
        if ((int)uVar26 < 1) {
          parasail_nw_scan_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_scan_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_scan_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_scan_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_scan_profile_sse2_128_16_cold_1();
        }
        else {
          uVar11 = uVar26 - 1;
          uVar23 = (ulong)uVar26 + 7 >> 3;
          uVar25 = -open;
          uVar26 = ppVar5->min;
          iVar27 = -uVar26;
          if (uVar26 != uVar25 && SBORROW4(uVar26,uVar25) == (int)(uVar26 + open) < 0) {
            iVar27 = open;
          }
          iVar19 = ppVar5->max;
          ppVar12 = parasail_result_new();
          if (ppVar12 != (parasail_result_t *)0x0) {
            iVar17 = (int)(uVar11 / uVar23);
            ppVar12->flag = ppVar12->flag | 0x8200401;
            ptr = parasail_memalign___m128i(0x10,uVar23);
            ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,uVar23);
            ptr_02 = parasail_memalign___m128i(0x10,uVar23);
            ptr_03 = parasail_memalign___m128i(0x10,uVar23);
            auVar32._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
            auVar32._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
            auVar32._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
            auVar32._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
            iVar13 = movmskps((int)ptr_00,auVar32);
            if (iVar13 != 0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_03 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            iVar13 = s2Len + -1;
            auVar32 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            uVar30 = auVar32._0_4_;
            auVar48._4_4_ = uVar30;
            auVar48._0_4_ = uVar30;
            auVar48._8_4_ = uVar30;
            auVar48._12_4_ = uVar30;
            auVar32 = pshuflw(auVar32,ZEXT416((uint)gap),0);
            uVar30 = auVar32._0_4_;
            uVar14 = iVar27 - 0x7fff;
            auVar32 = pshuflw(ZEXT416(uVar14),ZEXT416(uVar14),0);
            uVar31 = auVar32._0_4_;
            auVar50 = ZEXT416(CONCAT22((short)(uVar26 >> 0x10),0x7ffe - (short)iVar19));
            auVar50 = pshuflw(auVar50,auVar50,0);
            auVar51 = ZEXT416((uint)-((int)uVar23 * gap));
            auVar51 = pshuflw(auVar51,auVar51,0);
            uVar26 = auVar51._0_4_;
            auVar51._0_8_ = CONCAT44(uVar26,uVar26);
            auVar51._8_4_ = uVar26;
            auVar51._12_4_ = uVar26;
            auVar36._0_8_ = auVar51._0_8_ << 0x10;
            auVar36._8_8_ = auVar51._8_8_ << 0x10 | (ulong)(uVar26 >> 0x10);
            auVar51 = paddsw(auVar36,ZEXT416(uVar14 & 0xffff));
            lVar15 = (long)(int)uVar25;
            uVar22 = 0;
            do {
              lVar24 = 0;
              lVar21 = lVar15;
              do {
                uVar18 = 0x8000;
                if (-0x8000 < lVar21) {
                  uVar18 = (undefined2)lVar21;
                }
                *(undefined2 *)((long)&local_48 + lVar24 * 2) = uVar18;
                lVar20 = lVar21 - (ulong)(uint)open;
                if (lVar20 < -0x7fff) {
                  lVar20 = -0x8000;
                }
                *(short *)((long)&local_58 + lVar24 * 2) = (short)lVar20;
                lVar24 = lVar24 + 1;
                lVar21 = lVar21 - uVar23 * (uint)gap;
              } while (lVar24 != 8);
              ptr_02[uVar22][0] = local_48;
              ptr_02[uVar22][1] = lStack_40;
              ptr[uVar22][0] = local_58;
              ptr[uVar22][1] = lStack_50;
              uVar22 = uVar22 + 1;
              lVar15 = lVar15 - (ulong)(uint)gap;
            } while (uVar22 != uVar23);
            *ptr_00 = 0;
            auVar95 = _DAT_00904aa0;
            auVar36 = _DAT_00903aa0;
            lVar15 = (ulong)(uint)s2Len - 1;
            auVar75._8_4_ = (int)lVar15;
            auVar75._0_8_ = lVar15;
            auVar75._12_4_ = (int)((ulong)lVar15 >> 0x20);
            iVar19 = -gap;
            iVar27 = gap * 2;
            uVar22 = 0;
            auVar75 = auVar75 ^ _DAT_00903aa0;
            auVar57._8_4_ = 0xffffffff;
            auVar57._0_8_ = 0xffffffffffffffff;
            auVar57._12_4_ = 0xffffffff;
            uVar26 = uVar25;
            do {
              uVar49 = (undefined4)uVar22;
              auVar107._8_4_ = uVar49;
              auVar107._0_8_ = uVar22;
              auVar107._12_4_ = (int)(uVar22 >> 0x20);
              auVar59 = (auVar107 | _DAT_00903a90) ^ auVar36;
              iVar74 = auVar75._0_4_;
              auVar101._0_4_ = -(uint)(iVar74 < auVar59._0_4_);
              iVar81 = auVar75._4_4_;
              auVar101._4_4_ = -(uint)(iVar81 < auVar59._4_4_);
              iVar83 = auVar75._8_4_;
              auVar101._8_4_ = -(uint)(iVar83 < auVar59._8_4_);
              iVar84 = auVar75._12_4_;
              auVar101._12_4_ = -(uint)(iVar84 < auVar59._12_4_);
              auVar106._4_4_ = auVar101._0_4_;
              auVar106._0_4_ = auVar101._0_4_;
              auVar106._8_4_ = auVar101._8_4_;
              auVar106._12_4_ = auVar101._8_4_;
              auVar108 = pshuflw(in_XMM14,auVar106,0xe8);
              iVar66 = -(uint)(auVar59._4_4_ == iVar81);
              iVar71 = -(uint)(auVar59._12_4_ == iVar84);
              auVar53._4_4_ = iVar66;
              auVar53._0_4_ = iVar66;
              auVar53._8_4_ = iVar71;
              auVar53._12_4_ = iVar71;
              auVar86 = pshuflw(in_XMM8,auVar53,0xe8);
              auVar59._4_4_ = auVar101._4_4_;
              auVar59._0_4_ = auVar101._4_4_;
              auVar59._8_4_ = auVar101._12_4_;
              auVar59._12_4_ = auVar101._12_4_;
              auVar101 = pshuflw(auVar101,auVar59,0xe8);
              auVar86 = (auVar101 | auVar86 & auVar108) ^ auVar57;
              auVar101 = packssdw(auVar86,auVar86);
              uVar1 = gap * -3 + uVar26;
              auVar108._0_4_ = -(uint)(auVar95._0_4_ < (int)uVar26);
              auVar108._4_4_ = -(uint)(auVar95._4_4_ < iVar19 - open);
              auVar108._8_4_ = -(uint)(auVar95._8_4_ < (int)(uVar25 - iVar27));
              auVar108._12_4_ = -(uint)(auVar95._12_4_ < (int)uVar1);
              auVar86._0_4_ = uVar26 & auVar108._0_4_;
              auVar86._4_4_ = iVar19 - open & auVar108._4_4_;
              auVar86._8_4_ = uVar25 - iVar27 & auVar108._8_4_;
              auVar86._12_4_ = uVar1 & auVar108._12_4_;
              auVar86 = ~auVar108 & auVar95 | auVar86;
              if ((auVar101 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                ptr_00[uVar22 + 1] = auVar86._0_2_;
              }
              auVar59 = auVar53 & auVar106 | auVar59;
              auVar106 = packssdw(auVar59,auVar59);
              auVar106 = packssdw(auVar106 ^ auVar57,auVar106 ^ auVar57);
              if ((auVar106._0_4_ >> 0x10 & 1) != 0) {
                ptr_00[uVar22 + 2] = auVar86._4_2_;
              }
              auVar59 = (auVar107 | _DAT_00903a80) ^ auVar36;
              iVar66 = -(uint)(iVar74 < auVar59._0_4_);
              iVar98 = -(uint)(iVar81 < auVar59._4_4_);
              iVar71 = -(uint)(iVar83 < auVar59._8_4_);
              iVar100 = -(uint)(iVar84 < auVar59._12_4_);
              auVar52._4_4_ = iVar66;
              auVar52._0_4_ = iVar66;
              auVar52._8_4_ = iVar71;
              auVar52._12_4_ = iVar71;
              iVar66 = -(uint)(auVar59._4_4_ == iVar81);
              iVar71 = -(uint)(auVar59._12_4_ == iVar84);
              auVar60._4_4_ = iVar66;
              auVar60._0_4_ = iVar66;
              auVar60._8_4_ = iVar71;
              auVar60._12_4_ = iVar71;
              auVar102._4_4_ = iVar98;
              auVar102._0_4_ = iVar98;
              auVar102._8_4_ = iVar100;
              auVar102._12_4_ = iVar100;
              auVar59 = auVar60 & auVar52 | auVar102;
              auVar59 = packssdw(auVar59,auVar59);
              auVar59 = packssdw(auVar59 ^ auVar57,auVar59 ^ auVar57);
              if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                ptr_00[uVar22 + 3] = auVar86._8_2_;
              }
              auVar59 = pshufhw(auVar59,auVar52,0x84);
              auVar53 = pshufhw(auVar52,auVar60,0x84);
              auVar101 = pshufhw(auVar59,auVar102,0x84);
              auVar59 = (auVar101 | auVar53 & auVar59) ^ auVar57;
              auVar59 = packssdw(auVar59,auVar59);
              if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                ptr_00[uVar22 + 4] = auVar86._12_2_;
              }
              auVar33._4_4_ = uVar49;
              auVar33._0_4_ = uVar49;
              auVar33._8_4_ = uVar49;
              auVar33._12_4_ = uVar49;
              auVar33 = auVar33 | _DAT_00904a90;
              auVar87._4_4_ = gap;
              auVar87._0_4_ = gap;
              auVar87._8_4_ = gap;
              auVar87._12_4_ = gap;
              auVar88._0_8_ = (ulong)(uint)gap * (ulong)auVar33._4_4_;
              auVar88._8_8_ = (auVar87._8_8_ & 0xffffffff) * (ulong)auVar33._12_4_;
              auVar61._0_4_ = uVar25 - auVar33._0_4_ * gap;
              auVar61._4_4_ = uVar25 - (int)auVar88._0_8_;
              auVar61._8_4_ = uVar25 - (int)((auVar33._8_8_ & 0xffffffff) * (ulong)(uint)gap);
              auVar61._12_4_ = uVar25 - (int)auVar88._8_8_;
              auVar109._0_4_ = -(uint)(auVar95._0_4_ < auVar61._0_4_);
              auVar109._4_4_ = -(uint)(auVar95._4_4_ < auVar61._4_4_);
              auVar109._8_4_ = -(uint)(auVar95._8_4_ < auVar61._8_4_);
              auVar109._12_4_ = -(uint)(auVar95._12_4_ < auVar61._12_4_);
              in_XMM14 = ~auVar109 & auVar95 | auVar61 & auVar109;
              auVar59 = (auVar107 | _DAT_00903ad0) ^ auVar36;
              auVar34._0_4_ = -(uint)(iVar74 < auVar59._0_4_);
              auVar34._4_4_ = -(uint)(iVar81 < auVar59._4_4_);
              auVar34._8_4_ = -(uint)(iVar83 < auVar59._8_4_);
              auVar34._12_4_ = -(uint)(iVar84 < auVar59._12_4_);
              auVar62._4_4_ = auVar34._0_4_;
              auVar62._0_4_ = auVar34._0_4_;
              auVar62._8_4_ = auVar34._8_4_;
              auVar62._12_4_ = auVar34._8_4_;
              auVar86 = pshuflw(auVar88,auVar62,0xe8);
              auVar54._4_4_ = -(uint)(auVar59._4_4_ == iVar81);
              auVar54._12_4_ = -(uint)(auVar59._12_4_ == iVar84);
              auVar54._0_4_ = auVar54._4_4_;
              auVar54._8_4_ = auVar54._12_4_;
              auVar59 = pshuflw(auVar106,auVar54,0xe8);
              auVar55._4_4_ = auVar34._4_4_;
              auVar55._0_4_ = auVar34._4_4_;
              auVar55._8_4_ = auVar34._12_4_;
              auVar55._12_4_ = auVar34._12_4_;
              auVar106 = pshuflw(auVar34,auVar55,0xe8);
              auVar106 = (auVar106 | auVar59 & auVar86) ^ auVar57;
              auVar106 = packssdw(auVar106,auVar106);
              if ((auVar106 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                ptr_00[uVar22 + 5] = in_XMM14._0_2_;
              }
              auVar55 = auVar54 & auVar62 | auVar55;
              auVar59 = packssdw(auVar55,auVar55);
              auVar106 = packssdw(auVar106,auVar59 ^ auVar57);
              if ((auVar106 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                ptr_00[uVar22 + 6] = in_XMM14._4_2_;
              }
              auVar106 = (auVar107 | _DAT_00903ac0) ^ auVar36;
              auVar35._0_4_ = -(uint)(iVar74 < auVar106._0_4_);
              auVar35._4_4_ = -(uint)(iVar81 < auVar106._4_4_);
              auVar35._8_4_ = -(uint)(iVar83 < auVar106._8_4_);
              auVar35._12_4_ = -(uint)(iVar84 < auVar106._12_4_);
              auVar56._4_4_ = auVar35._0_4_;
              auVar56._0_4_ = auVar35._0_4_;
              auVar56._8_4_ = auVar35._8_4_;
              auVar56._12_4_ = auVar35._8_4_;
              iVar66 = -(uint)(auVar106._4_4_ == iVar81);
              iVar71 = -(uint)(auVar106._12_4_ == iVar84);
              auVar63._4_4_ = iVar66;
              auVar63._0_4_ = iVar66;
              auVar63._8_4_ = iVar71;
              auVar63._12_4_ = iVar71;
              auVar103._4_4_ = auVar35._4_4_;
              auVar103._0_4_ = auVar35._4_4_;
              auVar103._8_4_ = auVar35._12_4_;
              auVar103._12_4_ = auVar35._12_4_;
              in_XMM8 = auVar63 & auVar56 | auVar103;
              auVar106 = packssdw(auVar35,in_XMM8);
              auVar106 = packssdw(auVar106 ^ auVar57,auVar106 ^ auVar57);
              if ((auVar106 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                ptr_00[uVar22 + 7] = in_XMM14._8_2_;
              }
              auVar106 = pshufhw(auVar106,auVar56,0x84);
              auVar86 = pshufhw(auVar56,auVar63,0x84);
              auVar59 = pshufhw(auVar106,auVar103,0x84);
              auVar106 = (auVar59 | auVar86 & auVar106) ^ auVar57;
              auVar106 = packssdw(auVar106,auVar106);
              if ((auVar106 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                ptr_00[uVar22 + 8] = in_XMM14._12_2_;
              }
              uVar22 = uVar22 + 8;
              iVar19 = iVar19 + gap * -8;
              uVar26 = uVar26 + gap * -8;
              iVar27 = iVar27 + gap * 8;
            } while ((s2Len + 7U & 0xfffffff8) != uVar22);
            alVar46 = (__m128i)psubsw((undefined1  [16])0x0,auVar48);
            uVar26 = (int)uVar23 - 1;
            palVar16 = ptr_03 + uVar26;
            uVar22 = uVar23;
            do {
              *palVar16 = alVar46;
              auVar95._4_4_ = uVar30;
              auVar95._0_4_ = uVar30;
              auVar95._8_4_ = uVar30;
              auVar95._12_4_ = uVar30;
              alVar46 = (__m128i)psubsw((undefined1  [16])alVar46,auVar95);
              palVar16 = palVar16 + -1;
              iVar27 = (int)uVar22;
              uVar25 = iVar27 - 1;
              uVar22 = (ulong)uVar25;
            } while (uVar25 != 0 && 0 < iVar27);
            uVar22 = 0;
            auVar10._4_4_ = uVar31;
            auVar10._0_4_ = uVar31;
            auVar10._8_4_ = uVar31;
            auVar10._12_4_ = uVar31;
            local_c8 = auVar50._0_2_;
            uStack_c6 = auVar50._2_2_;
            auVar50 = auVar10;
            uVar58 = local_c8;
            uVar64 = uStack_c6;
            uVar65 = local_c8;
            uVar67 = uStack_c6;
            uVar68 = local_c8;
            uVar69 = uStack_c6;
            uVar70 = local_c8;
            uVar72 = uStack_c6;
            do {
              uVar9 = ptr_02[uVar26][0];
              auVar104._8_8_ = ptr_02[uVar26][1] << 0x10 | uVar9 >> 0x30;
              auVar104._0_8_ = uVar9 << 0x10 | (ulong)(ushort)ptr_00[uVar22];
              iVar27 = ppVar5->mapper[(byte)s2[uVar22]];
              auVar76 = psubsw(auVar10,(undefined1  [16])*ptr_03);
              lVar15 = 0;
              auVar36 = auVar10;
              do {
                auVar95 = *(undefined1 (*) [16])((long)*ptr_02 + lVar15);
                auVar106 = paddsw(auVar104,*(undefined1 (*) [16])
                                            ((long)pvVar4 + lVar15 + (long)iVar27 * uVar23 * 0x10));
                auVar75 = paddsw(auVar76,*(undefined1 (*) [16])((long)*ptr_03 + lVar15));
                auVar7._4_4_ = uVar30;
                auVar7._0_4_ = uVar30;
                auVar7._8_4_ = uVar30;
                auVar7._12_4_ = uVar30;
                auVar57 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar15),auVar7);
                sVar45 = auVar75._0_2_;
                sVar29 = auVar36._0_2_;
                auVar89._0_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar75._2_2_;
                sVar29 = auVar36._2_2_;
                auVar89._2_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar75._4_2_;
                sVar29 = auVar36._4_2_;
                auVar89._4_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar75._6_2_;
                sVar29 = auVar36._6_2_;
                auVar89._6_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar75._8_2_;
                sVar29 = auVar36._8_2_;
                auVar89._8_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar75._10_2_;
                sVar29 = auVar36._10_2_;
                auVar89._10_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar75._12_2_;
                sVar29 = auVar36._12_2_;
                sVar44 = auVar36._14_2_;
                auVar89._12_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar75._14_2_;
                auVar89._14_2_ =
                     (ushort)(sVar44 < sVar45) * sVar45 | (ushort)(sVar44 >= sVar45) * sVar44;
                auVar36 = psubsw(auVar95,auVar48);
                sVar45 = auVar57._0_2_;
                sVar29 = auVar36._0_2_;
                uVar28 = (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar57._2_2_;
                sVar29 = auVar36._2_2_;
                uVar37 = (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar57._4_2_;
                sVar29 = auVar36._4_2_;
                uVar38 = (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar57._6_2_;
                sVar29 = auVar36._6_2_;
                uVar39 = (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar57._8_2_;
                sVar29 = auVar36._8_2_;
                uVar40 = (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar57._10_2_;
                sVar29 = auVar36._10_2_;
                uVar41 = (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar57._12_2_;
                sVar29 = auVar36._12_2_;
                sVar44 = auVar36._14_2_;
                uVar42 = (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar57._14_2_;
                uVar43 = (ushort)(sVar44 < sVar45) * sVar45 | (ushort)(sVar44 >= sVar45) * sVar44;
                sVar45 = auVar106._0_2_;
                uVar73 = (sVar45 < (short)uVar28) * uVar28 |
                         (ushort)(sVar45 >= (short)uVar28) * sVar45;
                sVar45 = auVar106._2_2_;
                uVar79 = (sVar45 < (short)uVar37) * uVar37 |
                         (ushort)(sVar45 >= (short)uVar37) * sVar45;
                sVar45 = auVar106._4_2_;
                uVar80 = (sVar45 < (short)uVar38) * uVar38 |
                         (ushort)(sVar45 >= (short)uVar38) * sVar45;
                sVar45 = auVar106._6_2_;
                uVar82 = (sVar45 < (short)uVar39) * uVar39 |
                         (ushort)(sVar45 >= (short)uVar39) * sVar45;
                auVar76._0_8_ = CONCAT26(uVar82,CONCAT24(uVar80,CONCAT22(uVar79,uVar73)));
                sVar45 = auVar106._8_2_;
                auVar76._8_2_ =
                     (sVar45 < (short)uVar40) * uVar40 | (ushort)(sVar45 >= (short)uVar40) * sVar45;
                sVar45 = auVar106._10_2_;
                auVar76._10_2_ =
                     (sVar45 < (short)uVar41) * uVar41 | (ushort)(sVar45 >= (short)uVar41) * sVar45;
                sVar45 = auVar106._12_2_;
                sVar29 = auVar106._14_2_;
                auVar76._12_2_ =
                     (sVar45 < (short)uVar42) * uVar42 | (ushort)(sVar45 >= (short)uVar42) * sVar45;
                auVar76._14_2_ =
                     (sVar29 < (short)uVar43) * uVar43 | (ushort)(sVar29 >= (short)uVar43) * sVar29;
                puVar2 = (ushort *)((long)*ptr + lVar15);
                *puVar2 = uVar28;
                puVar2[1] = uVar37;
                puVar2[2] = uVar38;
                puVar2[3] = uVar39;
                puVar2[4] = uVar40;
                puVar2[5] = uVar41;
                puVar2[6] = uVar42;
                puVar2[7] = uVar43;
                *(undefined1 (*) [16])((long)*ptr_01 + lVar15) = auVar76;
                lVar15 = lVar15 + 0x10;
                auVar36 = auVar89;
                auVar104 = auVar95;
              } while (uVar23 << 4 != lVar15);
              auVar77._8_8_ = auVar76._8_8_ << 0x10 | (ulong)uVar82;
              uVar28 = ptr_00[uVar22 + 1];
              auVar77._0_8_ = auVar76._0_8_ << 0x10 | (ulong)uVar28;
              uVar22 = uVar22 + 1;
              auVar36 = paddsw((undefined1  [16])*ptr_03,auVar77);
              sVar45 = auVar36._0_2_;
              auVar90._0_2_ =
                   (ushort)((short)auVar89._0_2_ < sVar45) * sVar45 |
                   ((short)auVar89._0_2_ >= sVar45) * auVar89._0_2_;
              sVar45 = auVar36._2_2_;
              auVar90._2_2_ =
                   (ushort)((short)auVar89._2_2_ < sVar45) * sVar45 |
                   ((short)auVar89._2_2_ >= sVar45) * auVar89._2_2_;
              sVar45 = auVar36._4_2_;
              auVar90._4_2_ =
                   (ushort)((short)auVar89._4_2_ < sVar45) * sVar45 |
                   ((short)auVar89._4_2_ >= sVar45) * auVar89._4_2_;
              sVar45 = auVar36._6_2_;
              auVar90._6_2_ =
                   (ushort)((short)auVar89._6_2_ < sVar45) * sVar45 |
                   ((short)auVar89._6_2_ >= sVar45) * auVar89._6_2_;
              sVar45 = auVar36._8_2_;
              auVar90._8_2_ =
                   (ushort)((short)auVar89._8_2_ < sVar45) * sVar45 |
                   ((short)auVar89._8_2_ >= sVar45) * auVar89._8_2_;
              sVar45 = auVar36._10_2_;
              auVar90._10_2_ =
                   (ushort)((short)auVar89._10_2_ < sVar45) * sVar45 |
                   ((short)auVar89._10_2_ >= sVar45) * auVar89._10_2_;
              sVar45 = auVar36._12_2_;
              auVar90._12_2_ =
                   (ushort)((short)auVar89._12_2_ < sVar45) * sVar45 |
                   ((short)auVar89._12_2_ >= sVar45) * auVar89._12_2_;
              sVar45 = auVar36._14_2_;
              auVar90._14_2_ =
                   (ushort)((short)auVar89._14_2_ < sVar45) * sVar45 |
                   ((short)auVar89._14_2_ >= sVar45) * auVar89._14_2_;
              iVar27 = 6;
              do {
                auVar91._0_8_ = auVar90._0_8_ << 0x10;
                auVar91._8_8_ = auVar90._8_8_ << 0x10 | auVar90._0_8_ >> 0x30;
                auVar36 = paddsw(auVar91,auVar51);
                sVar45 = auVar90._0_2_;
                sVar85 = auVar36._0_2_;
                sVar29 = auVar90._2_2_;
                sVar96 = auVar36._2_2_;
                sVar44 = auVar90._4_2_;
                sVar97 = auVar36._4_2_;
                sVar6 = auVar90._6_2_;
                sVar99 = auVar36._6_2_;
                uVar37 = (ushort)(sVar99 < sVar6) * sVar6 | (ushort)(sVar99 >= sVar6) * sVar99;
                auVar92._0_8_ =
                     CONCAT26(uVar37,CONCAT24((ushort)(sVar97 < sVar44) * sVar44 |
                                              (ushort)(sVar97 >= sVar44) * sVar97,
                                              CONCAT22((ushort)(sVar96 < sVar29) * sVar29 |
                                                       (ushort)(sVar96 >= sVar29) * sVar96,
                                                       (ushort)(sVar85 < sVar45) * sVar45 |
                                                       (ushort)(sVar85 >= sVar45) * sVar85)));
                sVar45 = auVar90._8_2_;
                sVar29 = auVar36._8_2_;
                auVar92._8_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar90._10_2_;
                sVar29 = auVar36._10_2_;
                auVar92._10_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar90._12_2_;
                sVar29 = auVar36._12_2_;
                sVar44 = auVar36._14_2_;
                auVar92._12_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar90._14_2_;
                auVar92._14_2_ =
                     (ushort)(sVar44 < sVar45) * sVar45 | (ushort)(sVar44 >= sVar45) * sVar44;
                iVar27 = iVar27 + -1;
                auVar90 = auVar92;
              } while (iVar27 != 0);
              auVar93._0_8_ = auVar92._0_8_ << 0x10;
              auVar93._8_8_ = auVar92._8_8_ << 0x10 | (ulong)uVar37;
              auVar94 = paddsw(auVar93,ZEXT416(uVar14 & 0xffff));
              sVar45 = auVar94._0_2_;
              auVar78._0_2_ =
                   (ushort)((short)uVar28 < sVar45) * sVar45 | ((short)uVar28 >= sVar45) * uVar28;
              sVar45 = auVar94._2_2_;
              auVar78._2_2_ =
                   (ushort)((short)uVar73 < sVar45) * sVar45 | ((short)uVar73 >= sVar45) * uVar73;
              sVar45 = auVar94._4_2_;
              auVar78._4_2_ =
                   (ushort)((short)uVar79 < sVar45) * sVar45 | ((short)uVar79 >= sVar45) * uVar79;
              sVar45 = auVar94._6_2_;
              auVar78._6_2_ =
                   (ushort)((short)uVar80 < sVar45) * sVar45 | ((short)uVar80 >= sVar45) * uVar80;
              sVar45 = auVar94._8_2_;
              auVar78._8_2_ =
                   (ushort)((short)uVar82 < sVar45) * sVar45 | ((short)uVar82 >= sVar45) * uVar82;
              sVar45 = auVar94._10_2_;
              auVar78._10_2_ =
                   (ushort)((short)auVar76._8_2_ < sVar45) * sVar45 |
                   ((short)auVar76._8_2_ >= sVar45) * auVar76._8_2_;
              sVar45 = auVar94._12_2_;
              auVar78._12_2_ =
                   (ushort)((short)auVar76._10_2_ < sVar45) * sVar45 |
                   ((short)auVar76._10_2_ >= sVar45) * auVar76._10_2_;
              sVar45 = auVar94._14_2_;
              auVar78._14_2_ =
                   (ushort)((short)auVar76._12_2_ < sVar45) * sVar45 |
                   ((short)auVar76._12_2_ >= sVar45) * auVar76._12_2_;
              lVar15 = 0;
              auVar36 = auVar50;
              do {
                auVar8._4_4_ = uVar30;
                auVar8._0_4_ = uVar30;
                auVar8._8_4_ = uVar30;
                auVar8._12_4_ = uVar30;
                auVar95 = psubsw(auVar94,auVar8);
                auVar50 = psubsw(auVar78,auVar48);
                sVar45 = auVar50._0_2_;
                sVar29 = auVar95._0_2_;
                auVar94._0_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar50._2_2_;
                sVar29 = auVar95._2_2_;
                auVar94._2_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar50._4_2_;
                sVar29 = auVar95._4_2_;
                auVar94._4_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar50._6_2_;
                sVar29 = auVar95._6_2_;
                auVar94._6_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar50._8_2_;
                sVar29 = auVar95._8_2_;
                auVar94._8_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar50._10_2_;
                sVar29 = auVar95._10_2_;
                auVar94._10_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar50._12_2_;
                sVar29 = auVar95._12_2_;
                sVar44 = auVar95._14_2_;
                auVar94._12_2_ =
                     (ushort)(sVar29 < sVar45) * sVar45 | (ushort)(sVar29 >= sVar45) * sVar29;
                sVar45 = auVar50._14_2_;
                auVar94._14_2_ =
                     (ushort)(sVar44 < sVar45) * sVar45 | (ushort)(sVar44 >= sVar45) * sVar44;
                psVar3 = (short *)((long)*ptr_01 + lVar15);
                sVar45 = *psVar3;
                sVar29 = psVar3[1];
                sVar44 = psVar3[2];
                sVar6 = psVar3[3];
                sVar85 = psVar3[4];
                sVar96 = psVar3[5];
                sVar97 = psVar3[6];
                sVar99 = psVar3[7];
                auVar78._0_2_ =
                     (sVar45 < (short)auVar94._0_2_) * auVar94._0_2_ |
                     (ushort)(sVar45 >= (short)auVar94._0_2_) * sVar45;
                auVar78._2_2_ =
                     (sVar29 < (short)auVar94._2_2_) * auVar94._2_2_ |
                     (ushort)(sVar29 >= (short)auVar94._2_2_) * sVar29;
                auVar78._4_2_ =
                     (sVar44 < (short)auVar94._4_2_) * auVar94._4_2_ |
                     (ushort)(sVar44 >= (short)auVar94._4_2_) * sVar44;
                auVar78._6_2_ =
                     (sVar6 < (short)auVar94._6_2_) * auVar94._6_2_ |
                     (ushort)(sVar6 >= (short)auVar94._6_2_) * sVar6;
                auVar78._8_2_ =
                     (sVar85 < (short)auVar94._8_2_) * auVar94._8_2_ |
                     (ushort)(sVar85 >= (short)auVar94._8_2_) * sVar85;
                auVar78._10_2_ =
                     (sVar96 < (short)auVar94._10_2_) * auVar94._10_2_ |
                     (ushort)(sVar96 >= (short)auVar94._10_2_) * sVar96;
                auVar78._12_2_ =
                     (sVar97 < (short)auVar94._12_2_) * auVar94._12_2_ |
                     (ushort)(sVar97 >= (short)auVar94._12_2_) * sVar97;
                auVar78._14_2_ =
                     (sVar99 < (short)auVar94._14_2_) * auVar94._14_2_ |
                     (ushort)(sVar99 >= (short)auVar94._14_2_) * sVar99;
                *(undefined1 (*) [16])((long)*ptr_02 + lVar15) = auVar78;
                uVar58 = ((short)auVar78._0_2_ < (short)uVar58) * auVar78._0_2_ |
                         ((short)auVar78._0_2_ >= (short)uVar58) * uVar58;
                uVar64 = ((short)auVar78._2_2_ < (short)uVar64) * auVar78._2_2_ |
                         ((short)auVar78._2_2_ >= (short)uVar64) * uVar64;
                uVar65 = ((short)auVar78._4_2_ < (short)uVar65) * auVar78._4_2_ |
                         ((short)auVar78._4_2_ >= (short)uVar65) * uVar65;
                uVar67 = ((short)auVar78._6_2_ < (short)uVar67) * auVar78._6_2_ |
                         ((short)auVar78._6_2_ >= (short)uVar67) * uVar67;
                uVar68 = ((short)auVar78._8_2_ < (short)uVar68) * auVar78._8_2_ |
                         ((short)auVar78._8_2_ >= (short)uVar68) * uVar68;
                uVar69 = ((short)auVar78._10_2_ < (short)uVar69) * auVar78._10_2_ |
                         ((short)auVar78._10_2_ >= (short)uVar69) * uVar69;
                uVar70 = ((short)auVar78._12_2_ < (short)uVar70) * auVar78._12_2_ |
                         ((short)auVar78._12_2_ >= (short)uVar70) * uVar70;
                uVar72 = ((short)auVar78._14_2_ < (short)uVar72) * auVar78._14_2_ |
                         ((short)auVar78._14_2_ >= (short)uVar72) * uVar72;
                sVar45 = auVar36._0_2_;
                auVar50._0_2_ =
                     (sVar45 < (short)auVar78._0_2_) * auVar78._0_2_ |
                     (ushort)(sVar45 >= (short)auVar78._0_2_) * sVar45;
                sVar45 = auVar36._2_2_;
                auVar50._2_2_ =
                     (sVar45 < (short)auVar78._2_2_) * auVar78._2_2_ |
                     (ushort)(sVar45 >= (short)auVar78._2_2_) * sVar45;
                sVar45 = auVar36._4_2_;
                auVar50._4_2_ =
                     (sVar45 < (short)auVar78._4_2_) * auVar78._4_2_ |
                     (ushort)(sVar45 >= (short)auVar78._4_2_) * sVar45;
                sVar45 = auVar36._6_2_;
                auVar50._6_2_ =
                     (sVar45 < (short)auVar78._6_2_) * auVar78._6_2_ |
                     (ushort)(sVar45 >= (short)auVar78._6_2_) * sVar45;
                sVar45 = auVar36._8_2_;
                auVar50._8_2_ =
                     (sVar45 < (short)auVar78._8_2_) * auVar78._8_2_ |
                     (ushort)(sVar45 >= (short)auVar78._8_2_) * sVar45;
                sVar45 = auVar36._10_2_;
                auVar50._10_2_ =
                     (sVar45 < (short)auVar78._10_2_) * auVar78._10_2_ |
                     (ushort)(sVar45 >= (short)auVar78._10_2_) * sVar45;
                sVar45 = auVar36._12_2_;
                sVar29 = auVar36._14_2_;
                auVar50._12_2_ =
                     (sVar45 < (short)auVar78._12_2_) * auVar78._12_2_ |
                     (ushort)(sVar45 >= (short)auVar78._12_2_) * sVar45;
                auVar50._14_2_ =
                     (sVar29 < (short)auVar78._14_2_) * auVar78._14_2_ |
                     (ushort)(sVar29 >= (short)auVar78._14_2_) * sVar29;
                lVar15 = lVar15 + 0x10;
                auVar36 = auVar50;
              } while (uVar23 << 4 != lVar15);
            } while (uVar22 != (uint)s2Len);
            uVar22 = ptr_02[(ulong)uVar11 % uVar23][1];
            if (iVar17 < 7) {
              iVar27 = 0;
              uVar23 = ptr_02[(ulong)uVar11 % uVar23][0];
              do {
                uVar22 = uVar22 << 0x10 | uVar23 >> 0x30;
                iVar27 = iVar27 + 1;
                uVar23 = uVar23 << 0x10;
              } while (iVar27 < 7 - iVar17);
            }
            sVar45 = auVar32._0_2_;
            auVar105._0_2_ = -(ushort)((short)uVar58 < sVar45);
            sVar29 = auVar32._2_2_;
            auVar105._2_2_ = -(ushort)((short)uVar64 < sVar29);
            auVar105._4_2_ = -(ushort)((short)uVar65 < sVar45);
            auVar105._6_2_ = -(ushort)((short)uVar67 < sVar29);
            auVar105._8_2_ = -(ushort)((short)uVar68 < sVar45);
            auVar105._10_2_ = -(ushort)((short)uVar69 < sVar29);
            auVar105._12_2_ = -(ushort)((short)uVar70 < sVar45);
            auVar105._14_2_ = -(ushort)((short)uVar72 < sVar29);
            auVar47._0_2_ = -(ushort)((short)local_c8 < (short)auVar50._0_2_);
            auVar47._2_2_ = -(ushort)((short)uStack_c6 < (short)auVar50._2_2_);
            auVar47._4_2_ = -(ushort)((short)local_c8 < (short)auVar50._4_2_);
            auVar47._6_2_ = -(ushort)((short)uStack_c6 < (short)auVar50._6_2_);
            auVar47._8_2_ = -(ushort)((short)local_c8 < (short)auVar50._8_2_);
            auVar47._10_2_ = -(ushort)((short)uStack_c6 < (short)auVar50._10_2_);
            auVar47._12_2_ = -(ushort)((short)local_c8 < (short)auVar50._12_2_);
            auVar47._14_2_ = -(ushort)((short)uStack_c6 < (short)auVar50._14_2_);
            auVar47 = auVar47 | auVar105;
            if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar47 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar47 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar47 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar47 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar47 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar47 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar47 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar47 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar47 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar47 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar47 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar47 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar47[0xf]) {
              sVar45 = (short)(uVar22 >> 0x30);
            }
            else {
              *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
              sVar45 = 0;
              iVar13 = 0;
              uVar11 = 0;
            }
            ppVar12->score = (int)sVar45;
            ppVar12->end_query = uVar11;
            ppVar12->end_ref = iVar13;
            parasail_free(ptr_03);
            parasail_free(ptr_02);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            return ppVar12;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}